

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O1

int TeeDee::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_94;
  float local_88;
  float local_84;
  float local_80;
  
  pvVar2 = (state->field_0).field_0.effectdata;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = TeeDee::EffectData]");
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = TeeDee::EffectData]");
  }
  fVar15 = (float)(state->field_0).field_0.samplerate;
  fVar1 = *(float *)((long)pvVar2 + 0x138);
  local_80 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_80 = powf(0.01,1.0 / (fVar1 * fVar15));
  }
  fVar1 = *(float *)((long)pvVar2 + 0x13c);
  local_84 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_84 = powf(0.01,1.0 / (fVar1 * fVar15));
  }
  fVar1 = *(float *)((long)pvVar2 + 0x140);
  local_94 = 0.0;
  local_88 = 1.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_88 = powf(0.01,1.0 / (fVar1 * fVar15));
  }
  uVar9 = (state->field_0).field_0.flags;
  if ((uVar9 & 1) != 0) {
    if ((uVar9 & 6) == 0) {
      local_94 = 1.0;
    }
    else {
      local_94 = 0.0;
    }
  }
  if (length != 0) {
    fVar1 = *(float *)((long)pvVar2 + 0x15c);
    fVar16 = (fVar15 * 0.25 * 60.0) / *(float *)((long)pvVar2 + 0x120);
    uVar4 = (ulong)fVar16;
    uVar4 = (long)(fVar16 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
    uVar10 = 0;
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar5 = (state->field_0).field_0.currdsptick + uVar8;
      if ((uVar5 % uVar4 == 0) &&
         (iVar7 = (int)((uVar5 / uVar4) % (ulong)(long)(int)*(float *)((long)pvVar2 + 0x160)),
         *(int *)((long)pvVar2 + 0x164) = iVar7, *(int *)((long)pvVar2 + (long)iVar7 * 4) != 0)) {
        *(undefined4 *)((long)pvVar2 + 0x104) = *(undefined4 *)((long)pvVar2 + 0x14c);
        *(undefined8 *)((long)pvVar2 + 0x108) = *(undefined8 *)((long)pvVar2 + 0x150);
      }
      fVar16 = *(float *)((long)pvVar2 + 0x10c);
      fVar11 = (*(float *)((long)pvVar2 + 0x134) + fVar16) * (1.0 / fVar15) +
               *(float *)((long)pvVar2 + 0x100);
      fVar12 = floorf(fVar11);
      fVar11 = fVar11 - (float)(int)fVar12;
      *(float *)((long)pvVar2 + 0x100) = fVar11;
      *(float *)((long)pvVar2 + 0x104) = *(float *)((long)pvVar2 + 0x104) * local_80 + 1e-11;
      *(float *)((long)pvVar2 + 0x108) = *(float *)((long)pvVar2 + 0x108) * local_84 + 1e-11;
      *(float *)((long)pvVar2 + 0x10c) = fVar16 * local_88 + 1e-11;
      fVar16 = sinf((fVar11 + fVar11) * 3.1415927);
      uVar3 = *(int *)((long)pvVar2 + 0x168) * 0x19660d + 0x3c6ef35f;
      *(uint *)((long)pvVar2 + 0x168) = uVar3;
      fVar12 = atanf((fVar16 * *(float *)((long)pvVar2 + 0x124) +
                     ((float)((uVar3 & 0xffffff ^ uVar3 >> 0x10) * 2) * 5.960465e-08 + -1.0) *
                     *(float *)((long)pvVar2 + 0x128)) * *(float *)((long)pvVar2 + 0x158));
      fVar16 = *(float *)((long)pvVar2 + 0x104);
      fVar13 = *(float *)((long)pvVar2 + 300) + *(float *)((long)pvVar2 + 0x108);
      fVar11 = 0.0;
      if ((0.0 <= fVar13) && (fVar11 = fVar13, fVar15 * 0.5 < fVar13)) {
        fVar11 = fVar15 * 0.5;
      }
      fVar13 = sinf(fVar11 * 1.5707964 * (1.0 / fVar15));
      fVar14 = 1.0 - *(float *)((long)pvVar2 + 0x130);
      fVar11 = 1.4;
      if (fVar13 + fVar13 <= 1.4) {
        fVar11 = fVar13 + fVar13;
      }
      fVar13 = *(float *)((long)pvVar2 + 0x114);
      fVar17 = fVar11 * fVar13 + *(float *)((long)pvVar2 + 0x110);
      *(float *)((long)pvVar2 + 0x110) = fVar17;
      fVar16 = (fVar12 * 0.31830987 * fVar16 - fVar17) - fVar14 * fVar14 * fVar13;
      *(float *)((long)pvVar2 + 0x114) = fVar11 * fVar16 + fVar13;
      *(float *)((long)pvVar2 + 0x118) =
           (local_94 - *(float *)((long)pvVar2 + 0x118)) * 0.05 + 1e-09 +
           *(float *)((long)pvVar2 + 0x118);
      fVar16 = atanf(((fVar16 - fVar17) * *(float *)((long)pvVar2 + 0x144) + fVar17) *
                     *(float *)((long)pvVar2 + 0x148));
      if (0 < outchannels) {
        fVar11 = *(float *)((long)pvVar2 + 0x104);
        uVar5 = (ulong)(uint)outchannels;
        uVar6 = uVar10;
        uVar3 = uVar9;
        do {
          fVar12 = inbuffer[uVar6];
          outbuffer[uVar3] =
               ((fVar12 * fVar1 * 0.01 + fVar16 * 0.31830987 * fVar11) - fVar12) *
               *(float *)((long)pvVar2 + 0x118) + fVar12;
          uVar3 = uVar3 + 1;
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar8 = uVar8 + 1;
      uVar9 = uVar9 + outchannels;
      uVar10 = uVar10 + inchannels;
    } while (uVar8 != length);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float sr = (float)state->samplerate;
        float st = 1.0f / sr;
        float sr_half = sr * 0.5f;
        float adecay = (data->p[P_ADECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_ADECAY]));
        float fdecay = (data->p[P_FDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_FDECAY]));
        float pdecay = (data->p[P_PDECAY] == 0) ? 1.0f : powf(0.01f, 1.0f / (sr * data->p[P_PDECAY]));
        float wetTarget = ((state->flags & UnityAudioEffectStateFlags_IsPlaying) && !(state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))) ? 1.0f : 0.0f;
        float inputmix = data->p[P_INPUTMIX] * 0.01f;
        UInt64 pattern_length = (UInt64)(sr * 0.25f * 60.0f / data->p[P_BPM]);
        for (unsigned int n = 0; n < length; n++)
        {
            if (((state->currdsptick + n) % pattern_length) == 0)
            {
                data->pattern_index = ((state->currdsptick + n) / pattern_length) % (int)data->p[P_NUMSTEPS];
                if (data->pattern[data->pattern_index])
                {
                    data->aenv = data->p[P_AENV];
                    data->fenv = data->p[P_FENV];
                    data->penv = data->p[P_PENV];
                }
            }
            data->phase += (data->p[P_FREQ] + data->penv) * st;
            data->phase -= FastFloor(data->phase);
            data->aenv = data->aenv * adecay + 1.0e-11f;
            data->fenv = data->fenv * fdecay + 1.0e-11f;
            data->penv = data->penv * pdecay + 1.0e-11f;
            float outval = sinf(data->phase * 2.0f * kPI) * data->p[P_SINE] + data->random.GetFloat(-1.0f, 1.0f) * data->p[P_NOISE];
            outval = atanf(outval * data->p[P_PREDIST]) * (1.0f / kPI) * data->aenv;
            float cut = data->p[P_CUT] + data->fenv;
            if (cut < 0.0f)
                cut = 0.0f;
            else if (cut > sr_half)
                cut = sr_half;
            cut = 2.0f * sinf(0.5f * kPI * cut * st);
            if (cut > 1.4f)
                cut = 1.4f;
            float bw = 1.0f - data->p[P_RES]; bw *= bw;
            data->lpf += cut * data->bpf;
            float hpf = outval - data->lpf - data->bpf * bw;
            data->bpf += cut * hpf;
            data->wetmix += (wetTarget - data->wetmix) * 0.05f + 1.0e-9f;
            outval = data->lpf + (hpf - data->lpf) * data->p[P_FILTERTYPE];
            outval = atanf(outval * data->p[P_POSTDIST]) * (1.0f / kPI) * data->aenv;
            for (int i = 0; i < outchannels; i++)
            {
                float inval = inbuffer[n * inchannels + i];
                outbuffer[n * outchannels + i] = inval + (outval + inval * inputmix - inval) * data->wetmix;
            }
        }

        return UNITY_AUDIODSP_OK;
    }